

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O2

bool __thiscall
cmUnsetCommand::InitialPass
          (cmUnsetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  char *__s;
  bool bVar2;
  size_t sVar3;
  char *__dest;
  pointer pbVar4;
  long lVar5;
  pointer pbVar6;
  char *variable;
  allocator local_41;
  char *local_40;
  string local_38;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar6 || 0x40 < (ulong)((long)pbVar4 - (long)pbVar6)) {
    std::__cxx11::string::string
              ((string *)&local_38,"called with incorrect number of arguments",
               (allocator *)&local_40);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
LAB_002b81f1:
    std::__cxx11::string::~string((string *)&local_38);
    bVar2 = false;
  }
  else {
    local_40 = (pbVar6->_M_dataplus)._M_p;
    bVar2 = cmHasLiteralPrefix<char_const*,5ul>(&local_40,(char (*) [5])"ENV{");
    __s = local_40;
    if (bVar2) {
      sVar3 = strlen(local_40);
      if (sVar3 < 6) goto LAB_002b80f3;
      __dest = (char *)operator_new__(sVar3);
      sVar3 = strlen(__s);
      strncpy(__dest,__s + 4,sVar3 - 5);
      sVar3 = strlen(__s);
      __dest[sVar3 - 5] = '\0';
      cmSystemTools::UnsetEnv(__dest);
      operator_delete__(__dest);
    }
    else {
LAB_002b80f3:
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = (long)pbVar4 - (long)pbVar6 >> 5;
      if (lVar5 == 2) {
        bVar2 = std::operator==(pbVar6 + 1,"CACHE");
        if (!bVar2) {
          pbVar6 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_002b817c;
        }
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_38,local_40,&local_41);
        cmMakefile::RemoveCacheDefinition(pcVar1,&local_38);
      }
      else {
        if (lVar5 != 1) {
LAB_002b817c:
          if ((long)pbVar4 - (long)pbVar6 == 0x40) {
            bVar2 = std::operator==(pbVar6 + 1,"PARENT_SCOPE");
            if (bVar2) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string((string *)&local_38,local_40,&local_41);
              cmMakefile::RaiseScope(pcVar1,&local_38,(char *)0x0);
              goto LAB_002b81c0;
            }
          }
          std::__cxx11::string::string
                    ((string *)&local_38,"called with an invalid second argument",&local_41);
          cmCommand::SetError(&this->super_cmCommand,&local_38);
          goto LAB_002b81f1;
        }
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_38,local_40,&local_41);
        cmMakefile::RemoveDefinition(pcVar1,&local_38);
      }
LAB_002b81c0:
      std::__cxx11::string::~string((string *)&local_38);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmUnsetCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus &)
{
  if(args.size() < 1 || args.size() > 2)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  const char* variable = args[0].c_str();

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5)
    {
    // what is the variable name
    char *envVarName = new char [strlen(variable)];
    strncpy(envVarName,variable+4,strlen(variable)-5);
    envVarName[strlen(variable)-5] = '\0';

#ifdef CMAKE_BUILD_WITH_CMAKE
    cmSystemTools::UnsetEnv(envVarName);
#endif
    delete[] envVarName;
    return true;
    }
  // unset(VAR)
  else if (args.size() == 1)
    {
    this->Makefile->RemoveDefinition(variable);
    return true;
    }
  // unset(VAR CACHE)
  else if ((args.size() == 2) && (args[1] == "CACHE"))
    {
    this->Makefile->RemoveCacheDefinition(variable);
    return true;
    }
  // unset(VAR PARENT_SCOPE)
  else if ((args.size() == 2) && (args[1] == "PARENT_SCOPE"))
    {
    this->Makefile->RaiseScope(variable, 0);
    return true;
    }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  else
    {
    this->SetError("called with an invalid second argument");
    return false;
    }
}